

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extdev.c
# Opt level: O0

void envy_bios_print_extdev(envy_bios *bios,FILE *out,uint mask)

{
  envy_bios_extdev *peVar1;
  envy_bios_extdev_entry *peVar2;
  char *pcVar3;
  char *typename;
  envy_bios_extdev_entry *entry;
  int i;
  envy_bios_extdev *extdev;
  uint mask_local;
  FILE *out_local;
  envy_bios *bios_local;
  
  peVar1 = &bios->extdev;
  if ((peVar1->offset != 0) && ((mask & 0x80000) != 0)) {
    if ((bios->extdev).valid == '\0') {
      fprintf((FILE *)out,"Failed to parse EXTDEV table at 0x%04x version %d.%d\n\n",
              (ulong)peVar1->offset,(ulong)(uint)((int)(uint)(bios->extdev).version >> 4),
              (ulong)((bios->extdev).version & 0xf));
    }
    else {
      fprintf((FILE *)out,"EXTDEV table at 0x%04x version %d.%d",(ulong)peVar1->offset,
              (ulong)(uint)((int)(uint)(bios->extdev).version >> 4),
              (ulong)((bios->extdev).version & 0xf));
      if (4 < (bios->extdev).hlen) {
        fprintf((FILE *)out," unk04 0x%02x",(ulong)(bios->extdev).unk04);
      }
      fprintf((FILE *)out,"\n");
      envy_bios_dump_hex(bios,out,(uint)peVar1->offset,(uint)(bios->extdev).hlen,mask);
      for (entry._4_4_ = 0; (int)entry._4_4_ < (int)(uint)(bios->extdev).entriesnum;
          entry._4_4_ = entry._4_4_ + 1) {
        peVar2 = (bios->extdev).entries + (int)entry._4_4_;
        if ((peVar2->type != 0xff) || ((mask & 0x40000000) != 0)) {
          pcVar3 = find_enum(extdev_types,(uint)peVar2->type);
          fprintf((FILE *)out,"EXTDEV %d:",(ulong)entry._4_4_);
          fprintf((FILE *)out," type 0x%02x [%s]",(ulong)peVar2->type,pcVar3);
          fprintf((FILE *)out," at 0x%02x defbus %d",(ulong)peVar2->addr,(ulong)peVar2->bus);
          if (peVar2->unk02_0 != '\0') {
            fprintf((FILE *)out," unk02_0 %d",(ulong)peVar2->unk02_0);
          }
          if (peVar2->unk02_5 != '\0') {
            fprintf((FILE *)out," unk02_5 %d",(ulong)peVar2->unk02_5);
          }
          if (peVar2->unk03 != '\0') {
            fprintf((FILE *)out," unk03 0x%02x",(ulong)peVar2->unk03);
          }
          fprintf((FILE *)out,"\n");
        }
        envy_bios_dump_hex(bios,out,(uint)peVar2->offset,(uint)(bios->extdev).rlen,mask);
      }
      fprintf((FILE *)out,"\n");
    }
  }
  return;
}

Assistant:

void envy_bios_print_extdev (struct envy_bios *bios, FILE *out, unsigned mask) {
	struct envy_bios_extdev *extdev = &bios->extdev;
	if (!extdev->offset || !(mask & ENVY_BIOS_PRINT_EXTDEV))
		return;
	if (!extdev->valid) {
		fprintf(out, "Failed to parse EXTDEV table at 0x%04x version %d.%d\n\n", extdev->offset, extdev->version >> 4, extdev->version & 0xf);
		return;
	}
	fprintf(out, "EXTDEV table at 0x%04x version %d.%d", extdev->offset, extdev->version >> 4, extdev->version & 0xf);
	if (extdev->hlen > 4)
		fprintf(out, " unk04 0x%02x", extdev->unk04);
	fprintf(out, "\n");
	envy_bios_dump_hex(bios, out, extdev->offset, extdev->hlen, mask);
	int i;
	for (i = 0; i < extdev->entriesnum; i++) {
		struct envy_bios_extdev_entry *entry = &extdev->entries[i];
		if (entry->type != ENVY_BIOS_EXTDEV_UNUSED || mask & ENVY_BIOS_PRINT_UNUSED) {
			const char *typename = find_enum(extdev_types, entry->type);
			fprintf(out, "EXTDEV %d:", i);
			fprintf(out, " type 0x%02x [%s]", entry->type, typename);
			fprintf(out, " at 0x%02x defbus %d", entry->addr, entry->bus);
			if (entry->unk02_0)
				fprintf(out, " unk02_0 %d", entry->unk02_0);
			if (entry->unk02_5)
				fprintf(out, " unk02_5 %d", entry->unk02_5);
			if (entry->unk03)
				fprintf(out, " unk03 0x%02x", entry->unk03);
			fprintf(out, "\n");
		}
		envy_bios_dump_hex(bios, out, entry->offset, extdev->rlen, mask);
	}
	fprintf(out, "\n");
}